

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jbcoin::STTx::checkSign_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,STTx *this,bool allowMultiSign)

{
  bool bVar1;
  exception *anon_var_0;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  Blob local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  Blob *signingPubKey;
  STTx *pSStack_18;
  bool allowMultiSign_local;
  STTx *this_local;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *ret;
  
  signingPubKey._6_1_ = 0;
  signingPubKey._5_1_ = 0;
  signingPubKey._7_1_ = allowMultiSign;
  pSStack_18 = this;
  this_local = (STTx *)__return_storage_ptr__;
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bool,_const_char_(&)[1],_true>
            (__return_storage_ptr__,(bool *)((long)&signingPubKey + 5),(char (*) [1])0x46cf7c);
  if ((signingPubKey._7_1_ & 1) == 0) {
    checkSingleSign_abi_cxx11_
              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&anon_var_0,this);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(__return_storage_ptr__,(type)&anon_var_0);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&anon_var_0);
  }
  else {
    STObject::getFieldVL(&local_40,&this->super_STObject,(SField *)sfSigningPubKey);
    local_28 = &local_40;
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_28);
    if (bVar1) {
      checkMultiSign_abi_cxx11_(&local_78,this);
    }
    else {
      checkSingleSign_abi_cxx11_(&local_78,this);
    }
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(__return_storage_ptr__,&local_78);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair(&local_78);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> STTx::checkSign(bool allowMultiSign) const
{
    std::pair<bool, std::string> ret {false, ""};
    try
    {
        if (allowMultiSign)
        {
            // Determine whether we're single- or multi-signing by looking
            // at the SigningPubKey.  It it's empty we must be
            // multi-signing.  Otherwise we're single-signing.
            Blob const& signingPubKey = getFieldVL (sfSigningPubKey);
            ret = signingPubKey.empty () ?
                checkMultiSign () : checkSingleSign ();
        }
        else
        {
            ret = checkSingleSign ();
        }
    }
    catch (std::exception const&)
    {
        ret = {false, "Internal signature check failure."};
    }
    return ret;
}